

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hh
# Opt level: O0

bool __thiscall roaring::Roaring64Map::isFull(Roaring64Map *this)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  sVar3 = std::
          map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::size((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                  *)0x103c88);
  uVar2 = std::numeric_limits<unsigned_int>::max();
  if (sVar3 == (ulong)uVar2 + 1) {
    cVar4 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cbegin((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    cVar5 = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cend((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                    *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
    bVar1 = std::
            all_of<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,roaring::Roaring64Map::isFull()const::_lambda(std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                      (cVar4._M_node,cVar5._M_node);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isFull() const {
        // only bother to check if map is fully saturated
        //
        // we put std::numeric_limits<>::max/min in parentheses
        // to avoid a clash with the Windows.h header under Windows
        return roarings.size() ==
                       ((uint64_t)(std::numeric_limits<uint32_t>::max)()) + 1
                   ? std::all_of(roarings.cbegin(), roarings.cend(),
                                 [](const std::pair<const uint32_t, Roaring>
                                        &roaring_map_entry) {
                                     return roaring_map_entry.second.isFull();
                                 })
                   : false;
    }